

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O0

double getAvgLength(Settings *s,Data *d)

{
  reference pvVar1;
  reference pvVar2;
  ostream *poVar3;
  __type _Var4;
  __type _Var5;
  double dVar6;
  double lenavgpix;
  double lenavg;
  double len;
  int i;
  uint iseg;
  double lensum;
  Data *d_local;
  Settings *s_local;
  
  _i = 0.0;
  len._4_4_ = 0;
  for (len._0_4_ = 0; (int)len._0_4_ < d->ntrkptsum + -1; len._0_4_ = len._0_4_ + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&d->iEndSeg,(ulong)len._4_4_);
    if (len._0_4_ == *pvVar1) {
      len._4_4_ = len._4_4_ + 1;
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&d->lats,(long)(int)(len._0_4_ + 1));
      dVar6 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&d->lats,(long)(int)len._0_4_);
      _Var4 = std::pow<double,int>(dVar6 - *pvVar2,2);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&d->lons,(long)(int)(len._0_4_ + 1));
      dVar6 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&d->lons,(long)(int)len._0_4_);
      _Var5 = std::pow<double,int>(dVar6 - *pvVar2,2);
      dVar6 = sqrt(_Var4 + _Var5);
      _i = dVar6 + _i;
    }
  }
  dVar6 = (_i / (double)d->ntrkptsum) / s->degPerPix;
  poVar3 = std::operator<<((ostream *)&std::cout,"Average track length = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
  poVar3 = std::operator<<(poVar3," pixels");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return dVar6;
}

Assistant:

double getAvgLength(Settings& s, Data& d)
{
	double lensum = 0;
	unsigned int iseg = 0;
	for (int i = 0; i < d.ntrkptsum - 1; i++)
	{
		if (i == d.iEndSeg[iseg])
		{
			iseg++;
		}
		else
		{
			double len = sqrt(pow(d.lats[i+1] - d.lats[i], 2)
			                + pow(d.lons[i+1] - d.lons[i], 2));
			lensum += len;
			//std::cout << "len = " << len << "\n";
		}
	}

	double lenavg = lensum / d.ntrkptsum;
	double lenavgpix = lenavg / s.degPerPix;

	//std::cout << "lensum    = " << lensum    << std::endl;
	//std::cout << "lenavg    = " << lenavg    << std::endl;
	//std::cout << "lenavgpix / s.r = " << lenavgpix / s.r << std::endl;

	std::cout << "Average track length = " << lenavgpix
			<< " pixels" << std::endl;

	return lenavgpix;
}